

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

ExtensionRangeOptions * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_internal_mutable_options
          (DescriptorProto_ExtensionRange *this)

{
  Arena *arena;
  ExtensionRangeOptions *pEVar1;
  ExtensionRangeOptions *p;
  DescriptorProto_ExtensionRange *this_local;
  
  if ((this->field_0)._impl_.options_ == (ExtensionRangeOptions *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pEVar1 = (ExtensionRangeOptions *)
             Arena::DefaultConstruct<google::protobuf::ExtensionRangeOptions>(arena);
    (this->field_0)._impl_.options_ = pEVar1;
  }
  return (this->field_0)._impl_.options_;
}

Assistant:

inline ::google::protobuf::ExtensionRangeOptions* PROTOBUF_NONNULL DescriptorProto_ExtensionRange::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::ExtensionRangeOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::ExtensionRangeOptions*>(p);
  }
  return _impl_.options_;
}